

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  GLenum shadertype;
  GLenum precisiontype;
  bool bVar1;
  int (*paiVar2) [2];
  int *piVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_7e8;
  MessageBuilder local_668;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  StateQueryMemoryWriteGuard<unsigned_char> shaderCompiler;
  bool error;
  int local_28;
  undefined8 local_1c;
  RequiredFormat expected;
  PrecisionFormatCase *this_local;
  
  expected._4_8_ = this;
  join_0x00000010_0x00000000_ = getRequiredFormat(this);
  local_1c = stack0xffffffffffffffd0;
  expected.negativeRange = local_28;
  range.m_postguard[0]._3_1_ = 0;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_char> *)range.m_postguard);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[2]> *)&precision.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_58);
  shadertype = this->m_shaderType;
  precisiontype = this->m_precisionType;
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&precision.m_value);
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_58);
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&(this->super_ApiCase).super_CallLogWrapper,shadertype,precisiontype,*paiVar2,piVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[2]> *)&precision.m_value,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar1) {
    return;
  }
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_58,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar1) {
    return;
  }
  tcu::TestLog::operator<<
            (&local_1d8,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [12])0x2bcb651);
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&precision.m_value);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar2);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])0x2bcb65e);
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&precision.m_value);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*paiVar2 + 1);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])0x2bcb66b);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<int> *)local_58);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  if (this->m_precisionType == 0x8df2) {
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
    if ((*paiVar2)[0] == (int)local_1c) {
      paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
      if (((*paiVar2)[1] == local_1c._4_4_) &&
         (piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                             ((StateQueryMemoryWriteGuard *)local_58),
         *piVar3 == expected.negativeRange)) goto LAB_01df10d1;
    }
    tcu::TestLog::operator<<
              (&local_368,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_368,(char (*) [47])"// ERROR: Invalid precision format, expected:\n")
    ;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])"\trange[0] = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_1c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])"\trange[1] = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&local_1c + 4));
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])"\tprecision = ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&expected.negativeRange);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
    range.m_postguard[0]._3_1_ = 1;
  }
  else {
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
    if ((*paiVar2)[0] < (int)local_1c) {
      tcu::TestLog::operator<<
                (&local_4e8,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_4e8,
                          (char (*) [58])"// ERROR: Invalid range[0], expected greater or equal to "
                         );
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&local_1c);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e8);
      range.m_postguard[0]._3_1_ = 1;
    }
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&precision.m_value);
    if ((*paiVar2)[1] < local_1c._4_4_) {
      tcu::TestLog::operator<<
                (&local_668,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_668,
                          (char (*) [58])"// ERROR: Invalid range[1], expected greater or equal to "
                         );
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&local_1c + 4));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_668);
      range.m_postguard[0]._3_1_ = 1;
    }
    piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_58);
    if (*piVar3 < expected.negativeRange) {
      tcu::TestLog::operator<<
                (&local_7e8,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_7e8,
                          (char (*) [59])
                          "// ERROR: Invalid precision, expected greater or equal to ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&expected.negativeRange);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7e8);
      range.m_postguard[0]._3_1_ = 1;
    }
  }
LAB_01df10d1:
  if ((range.m_postguard[0]._3_1_ & 1) != 0) {
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got invalid precision/range");
  }
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// verify values

		if (m_precisionType == GL_HIGH_FLOAT)
		{
			// highp float must be IEEE 754 single

			if (range[0] != expected.negativeRange ||
				range[1] != expected.positiveRange ||
				precision != expected.precision)
			{
				m_log
					<< tcu::TestLog::Message
					<< "// ERROR: Invalid precision format, expected:\n"
					<< "\trange[0] = " << expected.negativeRange << "\n"
					<< "\trange[1] = " << expected.positiveRange << "\n"
					<< "\tprecision = " << expected.precision
					<< tcu::TestLog::EndMessage;
				error = true;
			}
		}
		else
		{
			if (range[0] < expected.negativeRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (range[1] < expected.positiveRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (precision < expected.precision)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
				error = true;
			}
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}